

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

string * get_description_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *node)

{
  bool bVar1;
  int __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Name/Number tree node",(allocator<char> *)&local_70);
  bVar1 = QPDFObjectHandle::isIndirect(node);
  if (bVar1) {
    __val = QPDFObjectHandle::getObjectID(node);
    std::__cxx11::to_string(&local_50,__val);
    std::operator+(&local_30," (object ",&local_50);
    std::operator+(&local_70,&local_30,")");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string
get_description(QPDFObjectHandle& node)
{
    std::string result("Name/Number tree node");
    if (node.isIndirect()) {
        result += " (object " + std::to_string(node.getObjectID()) + ")";
    }
    return result;
}